

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O1

int gdImagePixelate(gdImagePtr im,int block_size,uint mode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int total;
  int iVar6;
  int cx;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int b;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  
  iVar5 = 0;
  if (0 < block_size) {
    if (block_size != 1) {
      if (mode == 0) {
        if (0 < im->sy) {
          iVar5 = 0;
          do {
            if (0 < im->sx) {
              iVar10 = 0;
              do {
                iVar4 = gdImageBoundsSafe(im,iVar10,iVar5);
                if (iVar4 != 0) {
                  iVar4 = gdImageGetPixel(im,iVar10,iVar5);
                  gdImageFilledRectangle
                            (im,iVar10,iVar5,block_size + -1 + iVar10,block_size + -1 + iVar5,iVar4)
                  ;
                }
                iVar10 = iVar10 + block_size;
              } while (iVar10 < im->sx);
            }
            iVar5 = iVar5 + block_size;
          } while (iVar5 < im->sy);
        }
      }
      else {
        if (mode != 1) {
          return 0;
        }
        if (0 < im->sy) {
          iVar5 = 0;
          do {
            if (0 < im->sx) {
              iVar10 = 0;
              do {
                iVar4 = 0;
                iVar6 = 0;
                local_54 = 0;
                local_58 = 0;
                local_5c = 0;
                local_50 = 0;
                do {
                  iVar7 = 0;
                  do {
                    iVar1 = gdImageBoundsSafe(im,iVar10 + iVar7,iVar4 + iVar5);
                    if (iVar1 != 0) {
                      uVar2 = gdImageGetPixel(im,iVar10 + iVar7,iVar4 + iVar5);
                      if (im->trueColor == 0) {
                        uVar3 = im->alpha[(int)uVar2];
                        uVar8 = im->red[(int)uVar2];
                        uVar9 = im->green[(int)uVar2];
                        uVar2 = im->blue[(int)uVar2];
                      }
                      else {
                        uVar3 = uVar2 >> 0x18 & 0x7f;
                        uVar8 = uVar2 >> 0x10 & 0xff;
                        uVar9 = uVar2 >> 8 & 0xff;
                        uVar2 = uVar2 & 0xff;
                      }
                      local_50 = local_50 + uVar3;
                      local_5c = local_5c + uVar8;
                      local_58 = local_58 + uVar9;
                      local_54 = local_54 + uVar2;
                      iVar6 = iVar6 + 1;
                    }
                    iVar7 = iVar7 + 1;
                  } while (block_size != iVar7);
                  iVar4 = iVar4 + 1;
                } while (iVar4 != block_size);
                if (0 < iVar6) {
                  iVar4 = gdImageColorResolveAlpha
                                    (im,local_5c / iVar6,local_58 / iVar6,local_54 / iVar6,
                                     local_50 / iVar6);
                  gdImageFilledRectangle
                            (im,iVar10,iVar5,block_size + -1 + iVar10,block_size + -1 + iVar5,iVar4)
                  ;
                }
                iVar10 = iVar10 + block_size;
              } while (iVar10 < im->sx);
            }
            iVar5 = iVar5 + block_size;
          } while (iVar5 < im->sy);
        }
      }
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

BGD_DECLARE(int) gdImagePixelate(gdImagePtr im, int block_size, const unsigned int mode)
{
	int x, y;

	if (block_size <= 0) {
		return 0;
	} else if (block_size == 1) {
		return 1;
	}
	switch (mode) {
	case GD_PIXELATE_UPPERLEFT:
		for (y = 0; y < im->sy; y += block_size) {
			for (x = 0; x < im->sx; x += block_size) {
				if (gdImageBoundsSafe(im, x, y)) {
					int c = gdImageGetPixel(im, x, y);
					gdImageFilledRectangle(im, x, y, x + block_size - 1, y + block_size - 1, c);
				}
			}
		}
		break;
	case GD_PIXELATE_AVERAGE:
		for (y = 0; y < im->sy; y += block_size) {
			for (x = 0; x < im->sx; x += block_size) {
				int a, r, g, b, c;
				int total;
				int cx, cy;

				a = r = g = b = c = total = 0;
				/* sampling */
				for (cy = 0; cy < block_size; cy++) {
					for (cx = 0; cx < block_size; cx++) {
						if (!gdImageBoundsSafe(im, x + cx, y + cy)) {
							continue;
						}
						c = gdImageGetPixel(im, x + cx, y + cy);
						a += gdImageAlpha(im, c);
						r += gdImageRed(im, c);
						g += gdImageGreen(im, c);
						b += gdImageBlue(im, c);
						total++;
					}
				}
				/* drawing */
				if (total > 0) {
					c = gdImageColorResolveAlpha(im, r / total, g / total, b / total, a / total);
					gdImageFilledRectangle(im, x, y, x + block_size - 1, y + block_size - 1, c);
				}
			}
		}
		break;
	default:
		return 0;
	}
	return 1;
}